

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_sign(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  _func_char_ptr_uint *p_Var2;
  tclpkcs11_handle *handle;
  Tcl_Obj *pTVar3;
  Tcl_Obj *pTVar4;
  Tcl_Obj *pTVar5;
  int iVar6;
  uchar *puVar7;
  unsigned_long uVar8;
  char *pcVar9;
  Tcl_Obj *pTVar10;
  Tcl_Obj *pTVar11;
  ProcErrorProc *pPVar12;
  CK_RV CVar13;
  long lVar14;
  int tcl_keylist_llength;
  Tcl_Obj *local_508;
  CK_ULONG resultbuf_len;
  unsigned_long local_4f8;
  CK_MECHANISM *local_4f0;
  uchar *local_4e8;
  Tcl_Obj *local_4e0;
  Tcl_Obj *local_4d8;
  CK_OBJECT_HANDLE hObject;
  ClientData local_4c8;
  CK_ULONG foundObjs;
  long slotid_long;
  Tcl_Obj **tcl_keylist_values;
  CK_MECHANISM mechanism_desc_512;
  CK_MECHANISM mechanism_desc;
  CK_OBJECT_CLASS objectclass_pk;
  CK_ATTRIBUTE template [2];
  uchar resultbuf [1024];
  
  mechanism_desc.ulParameterLen = 0;
  mechanism_desc.mechanism = 0x1201;
  mechanism_desc.pParameter = (CK_VOID_PTR)0x0;
  mechanism_desc_512.ulParameterLen = 0;
  mechanism_desc_512.mechanism = 0xd4321006;
  mechanism_desc_512.pParameter = (CK_VOID_PTR)0x0;
  template[0].pValue = (CK_VOID_PTR)0x0;
  template[1].pValue = (CK_VOID_PTR)0x0;
  template[1].ulValueLen = 0;
  template[0].ulValueLen = 0;
  template[1].type = 0;
  template[0].type = 0x102;
  pTVar11 = objv[1];
  pTVar1 = objv[2];
  pTVar10 = objv[3];
  p_Var2 = tclStubsPtr->tcl_Alloc;
  local_4c8 = cd;
  iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  puVar7 = (uchar *)(*p_Var2)(iVar6 / 2);
  iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  uVar8 = tclpkcs11_string_to_bytearray(pTVar1,puVar7,(long)(iVar6 / 2));
  pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar11);
  iVar6 = bcmp("CKM_GOSTR3410_512",pcVar9,0x11);
  if (iVar6 == 0) {
    resultbuf_len = 0x80;
    if ((int)uVar8 == 0x40) {
      local_4f0 = &mechanism_desc_512;
LAB_00105fb7:
      local_4e8 = puVar7;
      if (1 < pTVar10->refCount) {
        pTVar10 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar10);
      }
      iVar6 = (*tclStubsPtr->tcl_ListObjGetElements)
                        ((Tcl_Interp_conflict *)interp,pTVar10,&tcl_keylist_llength,
                         &tcl_keylist_values);
      if (iVar6 != 0) {
        return iVar6;
      }
      if ((tcl_keylist_llength & 1U) != 0) {
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar9 = "list must have an even number of elements";
        goto LAB_00106126;
      }
      pTVar11 = (Tcl_Obj *)0x0;
      local_508 = (Tcl_Obj *)0x0;
      local_4e0 = (Tcl_Obj *)0x0;
      local_4d8 = (Tcl_Obj *)0x0;
      local_4f8 = uVar8;
      for (lVar14 = 0; pTVar1 = local_4e0, lVar14 < tcl_keylist_llength; lVar14 = lVar14 + 2) {
        pTVar1 = tcl_keylist_values[lVar14];
        pTVar10 = tcl_keylist_values[lVar14 + 1];
        pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar1);
        iVar6 = strcmp(pcVar9,"pkcs11_handle");
        pTVar3 = local_508;
        pTVar4 = local_4e0;
        pTVar5 = pTVar10;
        if (iVar6 != 0) {
          pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar1);
          iVar6 = strcmp(pcVar9,"pkcs11_slotid");
          pTVar3 = local_508;
          pTVar4 = pTVar10;
          pTVar5 = local_4d8;
          if (iVar6 != 0) {
            pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar1);
            iVar6 = strcmp(pcVar9,"pkcs11_id");
            pTVar3 = pTVar10;
            pTVar4 = local_4e0;
            pTVar5 = local_4d8;
            if (iVar6 != 0) {
              pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar1);
              iVar6 = strcmp(pcVar9,"hobj_privkey");
              pTVar3 = local_508;
              pTVar4 = local_4e0;
              pTVar5 = local_4d8;
              if (iVar6 == 0) {
                pTVar11 = pTVar10;
              }
            }
          }
        }
        local_4d8 = pTVar5;
        local_4e0 = pTVar4;
        local_508 = pTVar3;
      }
      if (local_4d8 == (Tcl_Obj *)0x0) {
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar9 = "could not find element named \"pkcs11_handle\" in keylist";
        goto LAB_001060f1;
      }
      if (local_4e0 == (Tcl_Obj *)0x0) {
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar9 = "could not find element named \"pkcs11_slotid\" in keylist";
      }
      else if (local_508 == (Tcl_Obj *)0x0 && pTVar11 == (Tcl_Obj *)0x0) {
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar9 = "could not find element named \"pkcs11_id or hobj_privkey\" in keylist";
      }
      else {
        lVar14 = (**(code **)((long)local_4c8 + 0x40))();
        if ((lVar14 != 0) &&
           (handle = *(tclpkcs11_handle **)(lVar14 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
          iVar6 = (*tclStubsPtr->tcl_GetLongFromObj)
                            ((Tcl_Interp_conflict *)interp,pTVar1,&slotid_long);
          if (iVar6 != 0) {
            return iVar6;
          }
          iVar6 = tclpkcs11_start_session(handle,slotid_long);
          pTVar1 = local_508;
          if (iVar6 == 0) {
            if (pTVar11 == (Tcl_Obj *)0x0) {
              p_Var2 = tclStubsPtr->tcl_Alloc;
              iVar6 = (*tclStubsPtr->tcl_GetCharLength)(local_508);
              puVar7 = (uchar *)(*p_Var2)(iVar6 / 2);
              template[0].pValue = puVar7;
              iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
              template[0].ulValueLen =
                   tclpkcs11_string_to_bytearray(pTVar1,puVar7,(long)(iVar6 / 2));
              template[1].pValue = &objectclass_pk;
              objectclass_pk = 3;
              template[1].ulValueLen = 8;
              CVar13 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,template,2);
              if (CVar13 == 0) {
                CVar13 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&foundObjs);
                if (CVar13 != 0) {
                  pPVar12 = tclStubsPtr->tcl_SetObjResult;
                  pTVar11 = tclpkcs11_pkcs11_error(CVar13);
                  (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar11);
                  (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                  return 1;
                }
                (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                iVar6 = (int)local_4f8;
                if (foundObjs == 0) {
                  pPVar12 = tclStubsPtr->tcl_SetObjResult;
                  pcVar9 = "PKCS11_ERROR MAYBE_LOGIN";
                  goto LAB_00106126;
                }
                goto LAB_0010627f;
              }
            }
            else {
              pcVar9 = (*tclStubsPtr->tcl_GetString)(pTVar11);
              pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar9 + 4,-1);
              iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar11);
              tclpkcs11_string_to_bytearray(pTVar11,(uchar *)&hObject,(long)(iVar6 / 2));
              iVar6 = (int)local_4f8;
LAB_0010627f:
              CVar13 = (*handle->pkcs11->C_SignInit)(handle->session,local_4f0,hObject);
              if ((CVar13 == 0) &&
                 (CVar13 = (*handle->pkcs11->C_Sign)
                                     (handle->session,local_4e8,(long)iVar6,resultbuf,&resultbuf_len
                                     ), CVar13 == 0)) {
                pTVar11 = tclpkcs11_bytearray_to_string(resultbuf,resultbuf_len);
                (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar11);
                return 0;
              }
            }
            pPVar12 = tclStubsPtr->tcl_SetObjResult;
          }
          else {
            CVar13 = (CK_RV)iVar6;
            pPVar12 = tclStubsPtr->tcl_SetObjResult;
          }
          pTVar11 = tclpkcs11_pkcs11_error(CVar13);
          goto LAB_00106132;
        }
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar9 = "invalid handle";
      }
LAB_00106126:
      pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar9,-1);
      goto LAB_00106132;
    }
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar9 = "\"pki::pkcs11::sign CKM_GOSTR3410_512 input\" - bad len hash";
  }
  else {
    iVar6 = bcmp("CKM_GOSTR3410",pcVar9,0xd);
    if (iVar6 == 0) {
      resultbuf_len = 0x40;
      if ((int)uVar8 == 0x20) {
        local_4f0 = &mechanism_desc;
        goto LAB_00105fb7;
      }
      pPVar12 = tclStubsPtr->tcl_SetObjResult;
      pcVar9 = "\"pki::pkcs11::sign CKM_GOSTR3410 input\" - bad len hash";
      local_4e8 = puVar7;
      goto LAB_00106126;
    }
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar9 = "\"pki::pkcs11::sign CKM_GOSTR3410|CKM_GOSTR3410_512 input\" - bad sign";
  }
LAB_001060f1:
  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar9,-1);
LAB_00106132:
  (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar11);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_sign(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "SIGN START\n");
  return(tclpkcs11_perform_pki_sign(cd, interp, objc, objv));
}